

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall c4::yml::Tree::_lookup_path_or_create(Tree *this,csubstr path,size_t start)

{
  csubstr cVar1;
  lookup_result r;
  lookup_result local_48;
  
  if (start == 0xffffffffffffffff) {
    start = root_id(this);
  }
  local_48.target = 0xffffffffffffffff;
  local_48.path_pos = 0;
  local_48.closest = start;
  local_48.path.str = path.str;
  local_48.path.len = path.len;
  _lookup_path(this,&local_48);
  if (local_48.target == 0xffffffffffffffff) {
    _lookup_path_modify(this,&local_48);
  }
  else {
    cVar1 = lookup_result::unresolved(&local_48);
    if (cVar1.str != (char *)0x0 && cVar1.len != 0) {
      _lookup_path_or_create();
    }
  }
  return local_48.target;
}

Assistant:

size_t Tree::_lookup_path_or_create(csubstr path, size_t start)
{
    if(start == NONE)
        start = root_id();
    lookup_result r(path, start);
    _lookup_path(&r);
    if(r.target != NONE)
    {
        C4_ASSERT(r.unresolved().empty());
        return r.target;
    }
    _lookup_path_modify(&r);
    return r.target;
}